

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

RegSP snap_renameref(GCtrace *T,SnapNo lim,IRRef ref,RegSP rs)

{
  IRIns *local_28;
  IRIns *ir;
  RegSP rs_local;
  IRRef ref_local;
  SnapNo lim_local;
  GCtrace *T_local;
  
  ir._4_4_ = rs;
  for (local_28 = T->ir + (T->nins - 1); (local_28->field_1).o == '\x14'; local_28 = local_28 + -1)
  {
    if (((local_28->field_0).op1 == ref) && ((local_28->field_0).op2 <= lim)) {
      ir._4_4_ = (RegSP)(local_28->field_0).prev;
    }
  }
  return ir._4_4_;
}

Assistant:

static RegSP snap_renameref(GCtrace *T, SnapNo lim, IRRef ref, RegSP rs)
{
  IRIns *ir;
  for (ir = &T->ir[T->nins-1]; ir->o == IR_RENAME; ir--)
    if (ir->op1 == ref && ir->op2 <= lim)
      rs = ir->prev;
  return rs;
}